

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void btreeEnterAll(sqlite3 *db)

{
  Btree *p;
  u8 uVar1;
  long lVar2;
  long lVar3;
  
  if (db->nDb < 1) {
    uVar1 = '\x01';
  }
  else {
    uVar1 = '\x01';
    lVar2 = 8;
    lVar3 = 0;
    do {
      p = *(Btree **)((long)&db->aDb->zDbSName + lVar2);
      if ((p != (Btree *)0x0) && (p->sharable != '\0')) {
        p->wantToLock = p->wantToLock + 1;
        uVar1 = '\0';
        if (p->locked == '\0') {
          btreeLockCarefully(p);
        }
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar3 < db->nDb);
  }
  db->noSharedCache = uVar1;
  return;
}

Assistant:

static void SQLITE_NOINLINE btreeEnterAll(sqlite3 *db){
  int i;
  int skipOk = 1;
  Btree *p;
  assert( sqlite3_mutex_held(db->mutex) );
  for(i=0; i<db->nDb; i++){
    p = db->aDb[i].pBt;
    if( p && p->sharable ){
      sqlite3BtreeEnter(p);
      skipOk = 0;
    }
  }
  db->noSharedCache = skipOk;
}